

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_info.hpp
# Opt level: O3

void __thiscall duckdb::CopyInfo::CopyInfo(CopyInfo *this)

{
  (this->super_ParseInfo).info_type = COPY_INFO;
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)&PTR__CopyInfo_024703c8;
  (this->catalog)._M_dataplus._M_p = (pointer)&(this->catalog).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->catalog,anon_var_dwarf_4f18422 + 9);
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->schema,"main","");
  (this->table)._M_dataplus._M_p = (pointer)&(this->table).field_2;
  (this->table)._M_string_length = 0;
  (this->table).field_2._M_local_buf[0] = '\0';
  (this->select_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->select_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->select_list).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->format)._M_dataplus._M_p = (pointer)&(this->format).field_2;
  (this->format)._M_string_length = 0;
  (this->format).field_2._M_local_buf[0] = '\0';
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  (this->options)._M_h._M_buckets = &(this->options)._M_h._M_single_bucket;
  (this->options)._M_h._M_bucket_count = 1;
  (this->options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->options)._M_h._M_element_count = 0;
  (this->options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->options)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->select_statement).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  return;
}

Assistant:

CopyInfo() : ParseInfo(TYPE), catalog(INVALID_CATALOG), schema(DEFAULT_SCHEMA) {
	}